

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void fread_pet(CHAR_DATA *ch,FILE *fp)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  MOB_INDEX_DATA *pMVar5;
  CHAR_DATA *pCVar6;
  AFFECT_DATA *pAVar7;
  long lVar8;
  uint uVar9;
  char *pcVar10;
  long *vector;
  int i;
  CHAR_DATA **ppCVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int vnum;
  int local_68;
  int local_64;
  AFFECT_DATA *local_60;
  CHAR_DATA *local_58;
  CLogger *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  local_68 = (int)current_time;
  iVar3 = feof((FILE *)fp);
  if (iVar3 == 0) {
    pcVar10 = fread_word(fp);
  }
  else {
    pcVar10 = "END";
  }
  bVar2 = str_cmp(pcVar10,"Vnum");
  if (bVar2) {
    fmt._M_str = "Fread_pet: no vnum in file.";
    fmt._M_len = 0x1b;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  }
  else {
    local_64 = fread_number(fp);
    pMVar5 = get_mob_index(0);
    if (pMVar5 == (MOB_INDEX_DATA *)0x0) {
      fmt_00._M_str = "Fread_pet: bad vnum {}.";
      fmt_00._M_len = 0x17;
      CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt_00,&local_64);
    }
  }
  pMVar5 = get_mob_index(0);
  pCVar6 = create_mobile(pMVar5);
  local_38 = pCVar6->comm;
  local_40 = pCVar6->act;
  local_48 = pCVar6->affected_by;
  local_50 = (CLogger *)&RS.field_0x140;
LAB_002bc792:
  iVar3 = feof((FILE *)fp);
  pcVar10 = "END";
  if (iVar3 == 0) {
    pcVar10 = fread_word(fp);
  }
  cVar1 = *pcVar10;
  uVar9 = (int)cVar1 - 0x20U & 0xff;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    uVar9 = (int)cVar1;
  }
  switch(uVar9) {
  case 0x41:
    bVar2 = str_cmp(pcVar10,"Act");
    vector = local_40;
    if ((!bVar2) || (bVar2 = str_cmp(pcVar10,"AfBy"), vector = local_48, !bVar2)) {
LAB_002bcc03:
      fread_flag_new(vector,fp);
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"Alig");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->alignment = (short)iVar3;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"ACs");
    if (!bVar2) {
      lVar8 = 0;
      do {
        iVar3 = fread_number(fp);
        pCVar6->armor[lVar8] = (short)iVar3;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"Affc");
    if (!bVar2) {
      pAVar7 = new_affect();
      init_affect(pAVar7);
      pcVar10 = fread_word(fp);
      iVar3 = skill_lookup(pcVar10);
      local_58 = ch;
      if (iVar3 < 0) {
        fmt_02._M_str = "Fread_char: unknown skill.";
        fmt_02._M_len = 0x1a;
        CLogger::Warn<>(local_50,fmt_02);
      }
      else {
        pAVar7->type = (short)iVar3;
      }
      iVar3 = fread_number(fp);
      pAVar7->where = (short)iVar3;
      iVar3 = fread_number(fp);
      pAVar7->level = (short)iVar3;
      iVar3 = fread_number(fp);
      pAVar7->duration = (short)iVar3;
      iVar3 = fread_number(fp);
      pAVar7->modifier = (short)iVar3;
      iVar3 = fread_number(fp);
      pAVar7->location = (short)iVar3;
      fread_flag_new(pAVar7->bitvector,fp);
      iVar3 = fread_number(fp);
      pAVar7->aftype = iVar3;
      pcVar10 = fread_word(fp);
      iVar3 = strcmp(pcVar10,"none");
      if (iVar3 != 0) {
        pAVar7->owner = local_58;
      }
      ppCVar11 = &char_list;
      local_60 = pAVar7;
      do {
        ppCVar11 = &((CHAR_DATA *)ppCVar11)->next->next;
        if ((CHAR_DATA *)ppCVar11 == (CHAR_DATA *)0x0) goto LAB_002bcd81;
        bVar2 = str_cmp(((CHAR_DATA *)ppCVar11)->name,pcVar10);
      } while (bVar2);
      local_60->owner = (CHAR_DATA *)ppCVar11;
LAB_002bcd81:
      pcVar10 = fread_word(fp);
      bVar2 = str_cmp(pcVar10,"none");
      pAVar7 = local_60;
      if (bVar2) {
        pcVar10 = palloc_string(pcVar10);
        pAVar7->name = pcVar10;
      }
      pAVar7->next = pCVar6->affected;
      pCVar6->affected = pAVar7;
      ch = local_58;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"AMod");
    if (!bVar2) {
      lVar8 = 0;
      do {
        iVar3 = fread_number(fp);
        pCVar6->mod_stat[lVar8] = (short)iVar3;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"Attr");
    if (!bVar2) {
      lVar8 = 0;
      do {
        iVar3 = fread_number(fp);
        pCVar6->perm_stat[lVar8] = (short)iVar3;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      goto LAB_002bc792;
    }
    break;
  case 0x42:
  case 0x46:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x51:
    break;
  case 0x43:
    bVar2 = str_cmp(pcVar10,"Comm");
    vector = local_38;
    if (!bVar2) goto LAB_002bcc03;
    bVar2 = str_cmp(pcVar10,"Cabal");
    if (!bVar2) {
      pcVar10 = fread_string(fp);
      iVar3 = cabal_lookup(pcVar10);
      pCVar6->cabal = (short)iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x44:
    bVar2 = str_cmp(pcVar10,"Dam");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->damroll = (short)iVar3;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"Desc");
    if (!bVar2) {
      pcVar10 = fread_string(fp);
      pCVar6->description = pcVar10;
      goto LAB_002bc792;
    }
    break;
  case 0x45:
    bVar2 = str_cmp(pcVar10,"End");
    if (!bVar2) {
      pCVar6->leader = ch;
      pCVar6->master = ch;
      ch->pet = pCVar6;
      lVar8 = CONCAT44(current_time._4_4_,(int)current_time) - (long)local_68;
      uVar9 = (int)((ulong)(lVar8 / 0x12 + (lVar8 >> 0x3f)) >> 4) - (int)(lVar8 >> 0x3f);
      if (((0 < (int)uVar9) && (bVar2 = is_affected_by(ch,0xc), !bVar2)) &&
         (bVar2 = is_affected_by(ch,0x17), !bVar2)) {
        uVar4 = 100;
        if (uVar9 < 100) {
          uVar4 = uVar9;
        }
        pCVar6->hit = (int)(((int)pCVar6->max_hit - pCVar6->hit) * uVar4) / 100 + pCVar6->hit;
        iVar3 = ((int)pCVar6->max_mana - (int)pCVar6->mana) * uVar4;
        pCVar6->mana = ((short)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x25) -
                       (short)(iVar3 >> 0x1f)) + pCVar6->mana;
        iVar3 = ((int)pCVar6->max_move - (int)pCVar6->move) * uVar4;
        pCVar6->move = ((short)(uint)((ulong)((long)iVar3 * 0x51eb851f) >> 0x25) -
                       (short)(iVar3 >> 0x1f)) + pCVar6->move;
      }
      return;
    }
    bVar2 = str_cmp(pcVar10,"Exp");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->exp = iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x47:
    bVar2 = str_cmp(pcVar10,"Gold");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->gold = (long)iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x48:
    bVar2 = str_cmp(pcVar10,"Hit");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->hitroll = (short)iVar3;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"HMV");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->hit = iVar3;
      iVar3 = fread_number(fp);
      pCVar6->max_hit = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar6->mana = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar6->max_mana = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar6->move = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar6->max_move = (short)iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x4c:
    bVar2 = str_cmp(pcVar10,"Levl");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->level = (short)iVar3;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"LnD");
    if (!bVar2) {
      pcVar10 = fread_string(fp);
      pCVar6->long_descr = pcVar10;
      goto LAB_002bc792;
    }
    bVar2 = str_cmp(pcVar10,"LogO");
    if (!bVar2) {
      local_68 = fread_number(fp);
      goto LAB_002bc792;
    }
    break;
  case 0x4e:
    bVar2 = str_cmp(pcVar10,"Name");
    if (!bVar2) {
      pcVar10 = fread_string(fp);
      pCVar6->name = pcVar10;
      goto LAB_002bc792;
    }
    break;
  case 0x50:
    bVar2 = str_cmp(pcVar10,"Pos");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar6->position = (short)iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x52:
    bVar2 = str_cmp(pcVar10,"Race");
    if (!bVar2) {
      pcVar10 = fread_string(fp);
      iVar3 = race_lookup(pcVar10);
      pCVar6->race = (short)iVar3;
      goto LAB_002bc792;
    }
    break;
  case 0x53:
    bVar2 = str_cmp(pcVar10,"Save");
    if (bVar2) {
      bVar2 = str_cmp(pcVar10,"Sex");
      if (bVar2) {
        bVar2 = str_cmp(pcVar10,"ShD");
        if (bVar2) break;
        pcVar10 = fread_string(fp);
        pCVar6->short_descr = pcVar10;
      }
      else {
        iVar3 = fread_number(fp);
        pCVar6->sex = (short)iVar3;
      }
    }
    else {
      iVar3 = fread_number(fp);
      pCVar6->saving_throw = (short)iVar3;
    }
    goto LAB_002bc792;
  default:
    if (uVar9 != 0x2a) break;
    goto LAB_002bcb66;
  }
  fmt_01._M_str = "Fread_pet: no match.";
  fmt_01._M_len = 0x14;
  CLogger::Warn<>(local_50,fmt_01);
LAB_002bcb66:
  fread_to_eol(fp);
  goto LAB_002bc792;
}

Assistant:

void fread_pet(CHAR_DATA *ch, FILE *fp)
{
	char *word;
	CHAR_DATA *pet;
	bool fMatch;
	int lastlogoff = current_time;
	int percent;

	/* first entry had BETTER be the vnum or we barf */
	word = feof(fp) ? (char *)"END" : fread_word(fp);

	if (!str_cmp(word, "Vnum"))
	{
		int vnum;

		vnum = fread_number(fp);

		if (get_mob_index(vnum) == nullptr)
		{
			RS.Logger.Warn("Fread_pet: bad vnum {}.", vnum);
			pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
		}
		else
		{
			pet = create_mobile(get_mob_index(vnum));
		}
	}
	else
	{
		RS.Logger.Warn("Fread_pet: no vnum in file.");
		pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
	}

	for (;;)
	{
		word = feof(fp) ? (char *)"END" : fread_word(fp);
		fMatch = false;

		switch (UPPER(word[0]))
		{
			case '*':
				fMatch = true;
				fread_to_eol(fp);
				break;
			case 'A':
				KEYV("Act", pet->act)
				KEYV("AfBy", pet->affected_by)
				KEY("Alig", pet->alignment, fread_number(fp))

				if (!str_cmp(word, "ACs"))
				{
					int i;

					for (i = 0; i < 4; i++)
					{
						pet->armor[i] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Affc"))
				{
					CHAR_DATA *wch = nullptr;
					char *owner;
					char *afname;
					AFFECT_DATA *paf;
					int sn;

					paf = new_affect();
					init_affect(paf);
					sn = skill_lookup(fread_word(fp));

					if (sn < 0)
						RS.Logger.Warn("Fread_char: unknown skill.");
					else
						paf->type = sn;

					paf->where = fread_number(fp);
					paf->level = fread_number(fp);
					paf->duration = fread_number(fp);
					paf->modifier = fread_number(fp);
					paf->location = fread_number(fp);

					fread_flag_new(paf->bitvector, fp);

					paf->aftype = fread_number(fp);

					owner = fread_word(fp);

					if (strcmp(owner, "none")) // safe default
						paf->owner = ch;

					for (wch = char_list; wch; wch = wch->next)
					{
						if (!str_cmp(wch->name, owner))
						{
							paf->owner = wch;
							break;
						}
					}

					afname = fread_word(fp);

					if (str_cmp(afname, "none"))
						paf->name = palloc_string(afname);

					paf->next = pet->affected;
					pet->affected = paf;
					fMatch = true;
					break;
				}

				if (!str_cmp(word, "AMod"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->mod_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Attr"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->perm_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				break;
			case 'C':
				KEYV("Comm", pet->comm)
				KEY("Cabal", pet->cabal, cabal_lookup(fread_string(fp)))
				break;
			case 'D':
				KEY("Dam", pet->damroll, fread_number(fp))
				KEY("Desc", pet->description, fread_string(fp))
				break;
			case 'E':
				if (!str_cmp(word, "End"))
				{
					pet->leader = ch;
					pet->master = ch;
					ch->pet = pet;
					/* adjust hp mana move up  -- here for speed's sake */
					percent = (current_time - lastlogoff) * 25 / (2 * 60 * 60);

					if (percent > 0 && !is_affected_by(ch, AFF_POISON) && !is_affected_by(ch, AFF_PLAGUE))
					{
						percent = std::min(percent, 100);
						pet->hit += (pet->max_hit - pet->hit) * percent / 100;
						pet->mana += (pet->max_mana - pet->mana) * percent / 100;
						pet->move += (pet->max_move - pet->move) * percent / 100;
					}

					return;
				}

				KEY("Exp", pet->exp, fread_number(fp))
				break;
			case 'G':
				KEY("Gold", pet->gold, fread_number(fp))
				break;
			case 'H':
				KEY("Hit", pet->hitroll, fread_number(fp))

				if (!str_cmp(word, "HMV"))
				{
					pet->hit = fread_number(fp);
					pet->max_hit = fread_number(fp);
					pet->mana = fread_number(fp);
					pet->max_mana = fread_number(fp);
					pet->move = fread_number(fp);
					pet->max_move = fread_number(fp);
					fMatch = true;
					break;
				}

				break;
			case 'L':
				KEY("Levl", pet->level, fread_number(fp))
				KEY("LnD", pet->long_descr, fread_string(fp))
				KEY("LogO", lastlogoff, fread_number(fp))
				break;
			case 'N':
				KEY("Name", pet->name, fread_string(fp))
				break;
			case 'P':
				KEY("Pos", pet->position, fread_number(fp))
				break;
			case 'R':
				KEY("Race", pet->race, race_lookup(fread_string(fp)))
				break;
			case 'S':
				KEY("Save", pet->saving_throw, fread_number(fp))
				KEY("Sex", pet->sex, fread_number(fp))
				KEY("ShD", pet->short_descr, fread_string(fp))
				break;
		}

		if (!fMatch)
		{
			RS.Logger.Warn("Fread_pet: no match.");
			fread_to_eol(fp);
		}
	}
}